

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O3

void makeipt(int nw,int *ip)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  ip[2] = 0;
  ip[3] = 0x10;
  if (0x20 < nw) {
    iVar4 = 2;
    do {
      iVar3 = iVar4 * 2;
      if (SBORROW4(iVar4,iVar3) != 0 < iVar4) {
        lVar5 = (long)iVar4;
        lVar6 = 0;
        do {
          iVar1 = ip[lVar5 + lVar6];
          ip[lVar5 * 2 + lVar6] = iVar1 * 4;
          ip[lVar5 + iVar3 + lVar6] = iVar4 * 0x10 + iVar1 * 4;
          lVar6 = lVar6 + 1;
        } while (iVar3 - lVar5 != lVar6);
      }
      bVar2 = 0x83 < (uint)nw;
      iVar4 = iVar3;
      nw = (uint)nw >> 2;
    } while (bVar2);
  }
  return;
}

Assistant:

void makeipt(int nw, int *ip)
{
    int j, l, m, m2, p, q;

    ip[2] = 0;
    ip[3] = 16;
    m = 2;
    for (l = nw; l > 32; l >>= 2) {
        m2 = m << 1;
        q = m2 << 3;
        for (j = m; j < m2; j++) {
            p = ip[j] << 2;
            ip[m + j] = p;
            ip[m2 + j] = p + q;
        }
        m = m2;
    }
}